

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int base64encode(char *encoded,char *string,int len)

{
  ulong uVar1;
  int iVar2;
  char *p;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = (int)encoded;
  uVar1 = 0;
  if (2 < len) {
    uVar1 = 0;
    do {
      *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(byte)string[uVar1] >> 2];
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)((byte)string[uVar1 + 1] >> 4) | ((byte)string[uVar1] & 3) << 4];
      encoded[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)((byte)string[uVar1 + 2] >> 6) + ((byte)string[uVar1 + 1] & 0xf) * 4];
      encoded[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(byte)string[uVar1 + 2] & 0x3f];
      encoded = encoded + 4;
      uVar1 = uVar1 + 3;
    } while ((long)uVar1 < (long)(len + -2));
  }
  if ((int)uVar1 < len) {
    uVar3 = uVar1 & 0xffffffff;
    *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(byte)string[uVar3] >> 2];
    uVar4 = (ulong)(((byte)string[uVar3] & 3) << 4);
    if ((int)uVar1 == len + -1) {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4];
      encoded[2] = '=';
    }
    else {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [uVar4 | (byte)string[uVar3 + 1] >> 4];
      encoded[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(ulong)((byte)string[uVar3 + 1] & 0xf) * 4];
    }
    encoded[3] = '=';
    encoded = encoded + 4;
  }
  *encoded = '\0';
  return ((int)encoded - iVar2) + 1;
}

Assistant:

int base64encode(char *encoded, const char *string, int len)
{
    int i;
    char *p;

    p = encoded;
    for (i = 0; i < len - 2; i += 3)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        *p++ = basis_64[((string[i] & 0x3) << 4) |
                        ((int)(string[i + 1] & 0xF0) >> 4)];
        *p++ = basis_64[((string[i + 1] & 0xF) << 2) |
                        ((int)(string[i + 2] & 0xC0) >> 6)];
        *p++ = basis_64[string[i + 2] & 0x3F];
    }
    if (i < len)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        if (i == (len - 1))
        {
            *p++ = basis_64[((string[i] & 0x3) << 4)];
            *p++ = '=';
        }
        else
        {
            *p++ = basis_64[((string[i] & 0x3) << 4) |
                            ((int)(string[i + 1] & 0xF0) >> 4)];
            *p++ = basis_64[((string[i + 1] & 0xF) << 2)];
        }
        *p++ = '=';
    }

    *p++ = '\0';
    return p - encoded;
}